

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int tonumeral(expdesc *e,TValue *v)

{
  TValue *io_1;
  TValue *io;
  TValue *v_local;
  expdesc *e_local;
  
  if (e->t == e->f) {
    if (e->k == VKFLT) {
      if (v != (TValue *)0x0) {
        v->value_ = (Value)(e->u).ival;
        v->tt_ = 3;
      }
      e_local._4_4_ = 1;
    }
    else if (e->k == VKINT) {
      if (v != (TValue *)0x0) {
        v->value_ = (Value)(e->u).ival;
        v->tt_ = 0x13;
      }
      e_local._4_4_ = 1;
    }
    else {
      e_local._4_4_ = 0;
    }
  }
  else {
    e_local._4_4_ = 0;
  }
  return e_local._4_4_;
}

Assistant:

static int tonumeral(const expdesc *e, TValue *v) {
  if (hasjumps(e))
    return 0;  /* not a numeral */
  switch (e->k) {
    case VKINT:
      if (v) setivalue(v, e->u.ival);
      return 1;
    case VKFLT:
      if (v) setfltvalue(v, e->u.nval);
      return 1;
    default: return 0;
  }
}